

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O0

int faup_snapshot_item_append(faup_snapshot_t *snapshot,char *item_name)

{
  faup_snapshot_item_t *pfVar1;
  faup_snapshot_item_t **ppfVar2;
  void *arg;
  faup_snapshot_item_t *item;
  char *item_name_local;
  faup_snapshot_t *snapshot_local;
  
  pfVar1 = faup_snapshot_item_get(snapshot,item_name);
  if (pfVar1 == (faup_snapshot_item_t *)0x0) {
    ppfVar2 = (faup_snapshot_item_t **)realloc(snapshot->items,(snapshot->length + 1) * 8);
    snapshot->items = ppfVar2;
    if (snapshot->items == (faup_snapshot_item_t **)0x0) {
      fprintf(_stderr,"Cannot allocatate a snapshot_item!\n");
      return -1;
    }
    pfVar1 = faup_snapshot_item_new(item_name);
    snapshot->items[snapshot->length] = pfVar1;
    snapshot->length = snapshot->length + 1;
    qsort(snapshot->items,snapshot->length,8,compare_simple);
  }
  return 0;
}

Assistant:

int faup_snapshot_item_append(faup_snapshot_t *snapshot, char *item_name)
{
  faup_snapshot_item_t *item;
  void *arg;
  
  item = faup_snapshot_item_get(snapshot, item_name);
  if (!item) {
    snapshot->items = realloc(snapshot->items, sizeof(faup_snapshot_item_t *) * (snapshot->length + 1));
    if (!snapshot->items) {
      fprintf(stderr, "Cannot allocatate a snapshot_item!\n");
      return -1;
    }
    snapshot->items[snapshot->length] = faup_snapshot_item_new(item_name);
    snapshot->length++;

    qsort(snapshot->items, snapshot->length, sizeof(faup_snapshot_item_t *), compare_simple);

  }
  
  return 0;
}